

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O0

uint32_t helper_saddsubx_arm(uint32_t a,uint32_t b,void *gep)

{
  uint uVar1;
  int iVar2;
  int32_t sum_1;
  int32_t sum;
  uint32_t ge;
  uint32_t res;
  void *gep_local;
  uint32_t b_local;
  uint32_t a_local;
  
  sum_1 = 0;
  uVar1 = (int)(short)a - (int)(short)(b >> 0x10);
  if (-1 < (int)uVar1) {
    sum_1 = 3;
  }
  iVar2 = (int)(short)(a >> 0x10) + (int)(short)b;
  if (-1 < iVar2) {
    sum_1 = sum_1 | 0xc;
  }
  *(int32_t *)gep = sum_1;
  return iVar2 * 0x10000 | uVar1 & 0xffff;
}

Assistant:

uint32_t HELPER(glue(PFX,addsubx))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    SUB16(a, b >> 16, 0);
    ADD16(a >> 16, b, 1);
    SET_GE;
    return res;
}